

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.h
# Opt level: O3

void __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::Node::AddChild(Node *this,Node *child)

{
  pointer *pppNVar1;
  iterator __position;
  Node *local_10;
  Node *child_local;
  
  __position._M_current =
       (this->children_).
       super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->children_).
      super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_10 = child;
    std::
    vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node*,std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node*>>
    ::_M_realloc_insert<google::protobuf::util::converter::DefaultValueObjectWriter::Node*const&>
              ((vector<google::protobuf::util::converter::DefaultValueObjectWriter::Node*,std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node*>>
                *)&this->children_,__position,&local_10);
  }
  else {
    *__position._M_current = child;
    pppNVar1 = &(this->children_).
                super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  return;
}

Assistant:

void AddChild(Node* child) { children_.push_back(child); }